

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

int is_pattern_silent(IT_PATTERN *pattern,int order)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  IT_ENTRY *pIVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  IT_ENTRY *pIVar10;
  
  if (pattern == (IT_PATTERN *)0x0) {
    return 2;
  }
  iVar3 = pattern->n_rows;
  if (iVar3 == 0) {
    return 2;
  }
  iVar7 = pattern->n_entries;
  if ((long)iVar7 == 0) {
    return 2;
  }
  pIVar5 = pattern->entry;
  if (pIVar5 == (IT_ENTRY *)0x0) {
    return 2;
  }
  if (iVar7 == iVar3) {
    iVar8 = 0;
    pIVar10 = pIVar5;
    iVar4 = 0;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    for (; (iVar6 = iVar4, iVar4 != iVar8 && (iVar6 = iVar8, 0x3f < pIVar10->channel));
        pIVar10 = pIVar10 + 1) {
      iVar8 = iVar8 + 1;
    }
    if (iVar6 == iVar3) {
      return 2;
    }
  }
  pIVar10 = pIVar5 + iVar7;
  iVar7 = 1;
  iVar3 = 0;
  for (; iVar4 = iVar7, pIVar5 < pIVar10; pIVar5 = pIVar5 + 1) {
    if (pIVar5->channel < 0x40) {
      bVar1 = pIVar5->mask;
      if ((bVar1 & 6) != 0) {
        return 0;
      }
      if (((bVar1 & 1) != 0) && (pIVar5->note < 0x78)) {
        return 0;
      }
      if ((bVar1 & 8) != 0) {
        uVar2 = pIVar5->effect;
        iVar4 = iVar3;
        switch(uVar2) {
        case '\f':
        case '\x0f':
        case '\x16':
        case '\x17':
          bVar1 = pIVar5->effectvalue;
joined_r0x00580318:
          if (bVar1 != 0) {
            return 0;
          }
          break;
        case '\r':
        case '\x0e':
        case '\x10':
        case '\x11':
        case '\x12':
        case '\x15':
          goto switchD_00580290_caseD_d;
        case '\x13':
          bVar1 = pIVar5->effectvalue;
          switch(bVar1 >> 4) {
          case 6:
          case 0xb:
          case 0xe:
            iVar7 = iVar7 + 1;
            break;
          case 7:
            if (2 < (bVar1 & 0xf)) {
              return 0;
            }
            break;
          case 8:
          case 9:
          case 10:
          case 0xc:
          case 0xd:
            goto switchD_00580290_caseD_d;
          default:
            if (bVar1 >> 4 == 0) goto joined_r0x00580318;
            goto switchD_00580290_caseD_d;
          }
          break;
        case '\x14':
          break;
        default:
          if (uVar2 == '\x01') {
            iVar7 = (iVar7 + 1) - (uint)(pIVar5->effectvalue < 0x41);
          }
          else {
            if (uVar2 == '\x02') {
              uVar9 = (uint)pIVar5->effectvalue;
            }
            else {
              if (uVar2 != '\x03') {
                if (uVar2 != ' ') {
                  return 0;
                }
                break;
              }
              uVar9 = (pIVar5->effectvalue & 0xf) + (uint)(pIVar5->effectvalue >> 4) * 10;
            }
            if (uVar9 != order) {
              return 0;
            }
          }
        }
      }
    }
  }
switchD_00580290_caseD_d:
  return iVar4;
}

Assistant:

static int is_pattern_silent(IT_PATTERN * pattern, int order) {
	int ret = 1;
	IT_ENTRY * entry, * end;
	if (!pattern || !pattern->n_rows || !pattern->n_entries || !pattern->entry) return 2;

	if ( pattern->n_entries == pattern->n_rows ) {
		int n;
		entry = pattern->entry;
		for ( n = 0; n < pattern->n_entries; ++n, ++entry ) {
			if ( !IT_IS_END_ROW(entry) ) break;
		}
		if ( n == pattern->n_entries ) return 2;
		// broken?
	}

	entry = pattern->entry;
	end = entry + pattern->n_entries;

	while (entry < end) {
		if (!IT_IS_END_ROW(entry)) {
			if (entry->mask & (IT_ENTRY_INSTRUMENT | IT_ENTRY_VOLPAN))
				return 0;
			if (entry->mask & IT_ENTRY_NOTE && entry->note < 120)
				return 0;
			if (entry->mask & IT_ENTRY_EFFECT) {
				switch (entry->effect) {
					case IT_SET_GLOBAL_VOLUME:
						if (entry->effectvalue) return 0;
						break;

					case IT_SET_SPEED:
						if (entry->effectvalue > 64) ret++;
						break;

					case IT_SET_SONG_TEMPO:
					case IT_XM_KEY_OFF:
						break;

					case IT_JUMP_TO_ORDER:
						if (entry->effectvalue != order)
							return 0;
						break;

					case IT_S:
						switch (entry->effectvalue >> 4) {
							case 0: // meh bastard
								if ( entry->effectvalue != 0 ) return 0;
								break;

							case IT_S_FINE_PATTERN_DELAY:
							case IT_S_PATTERN_LOOP:
							case IT_S_PATTERN_DELAY:
								ret++;
								break;

							case IT_S7:
								if ((entry->effectvalue & 15) > 2)
									return 0;
								break;

							default:
								return 0;
						}
						break;

					// clever idiot with his S L O W crap; do nothing
					case IT_VOLSLIDE_TONEPORTA:
					case IT_SET_SAMPLE_OFFSET:
					case IT_GLOBAL_VOLUME_SLIDE:
						if ( entry->effectvalue != 0 ) return 0;
						break;

					// genius also uses this instead of jump to order by mistake, meh, and it's bloody BCD
					case IT_BREAK_TO_ROW:						
						if ( ( ( entry->effectvalue >> 4 ) * 10 + ( entry->effectvalue & 15 ) ) != order ) return 0;
						break;

					default:
						return 0;
				}
			}
		}
		entry++;
	}

	return ret;
}